

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcopy.c
# Opt level: O2

void dcopy_(integer *n,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  int iVar1;
  doublereal *pdVar2;
  doublereal *pdVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  
  uVar4 = *n;
  if (0 < (int)uVar4) {
    iVar1 = *incx;
    if ((long)iVar1 == 1) {
      iVar5 = *incy;
      if (iVar5 == 1) {
        if (uVar4 % 7 != 0) {
          for (uVar7 = 0; (ulong)uVar4 % 7 != uVar7; uVar7 = uVar7 + 1) {
            dy[uVar7] = dx[uVar7];
          }
          if ((int)uVar4 < 7) {
            return;
          }
        }
        for (uVar7 = (ulong)(uVar4 % 7 + 1); uVar7 <= uVar4; uVar7 = uVar7 + 7) {
          dy[uVar7 - 1] = dx[uVar7 - 1];
          dy[uVar7] = dx[uVar7];
          dy[uVar7 + 1] = dx[uVar7 + 1];
          dy[uVar7 + 2] = dx[uVar7 + 2];
          dy[uVar7 + 3] = dx[uVar7 + 3];
          dy[uVar7 + 4] = dx[uVar7 + 4];
          dy[uVar7 + 5] = dx[uVar7 + 5];
        }
        return;
      }
      iVar6 = 1 - uVar4;
      lVar9 = 1;
    }
    else {
      iVar6 = 1 - uVar4;
      iVar8 = iVar1 * iVar6 + 1;
      if (-1 < iVar1) {
        iVar8 = 1;
      }
      iVar5 = *incy;
      lVar9 = (long)iVar8;
    }
    iVar8 = 1;
    if (iVar5 < 0) {
      iVar8 = iVar6 * iVar5 + 1;
    }
    pdVar2 = dy + (long)iVar8 + -1;
    pdVar3 = dx + lVar9 + -1;
    while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
      *pdVar2 = *pdVar3;
      pdVar2 = pdVar2 + iVar5;
      pdVar3 = pdVar3 + iVar1;
    }
  }
  return;
}

Assistant:

void dcopy_(integer *n, doublereal *dx, integer *incx, 
	doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     copies a vector, x, to a vector, y.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) = DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 7;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) = DX(i);
/* L30: */
    }
    if (*n < 7) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 7) {
	DY(i) = DX(i);
	DY(i + 1) = DX(i + 1);
	DY(i + 2) = DX(i + 2);
	DY(i + 3) = DX(i + 3);
	DY(i + 4) = DX(i + 4);
	DY(i + 5) = DX(i + 5);
	DY(i + 6) = DX(i + 6);
/* L50: */
    }
    return;
}